

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polycurve.cpp
# Opt level: O0

ON_Curve * __thiscall ON_PolyCurve::DuplicateCurve(ON_PolyCurve *this)

{
  int capacity;
  int iVar1;
  ON_PolyCurve *this_00;
  ON_Curve *pOVar2;
  undefined4 extraout_var;
  double *t;
  ON_Curve *seg;
  int i;
  ON_PolyCurve *dup_crv;
  int cnt;
  ON_PolyCurve *this_local;
  
  capacity = Count(this);
  this_00 = (ON_PolyCurve *)operator_new(0x40);
  ON_PolyCurve(this_00,capacity);
  ON_Object::CopyUserData((ON_Object *)this_00,(ON_Object *)this);
  for (seg._0_4_ = 0; (int)seg < capacity; seg._0_4_ = (int)seg + 1) {
    pOVar2 = SegmentCurve(this,(int)seg);
    if (pOVar2 != (ON_Curve *)0x0) {
      iVar1 = (*(pOVar2->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x24])();
      Append(this_00,(ON_Curve *)CONCAT44(extraout_var,iVar1));
    }
  }
  iVar1 = Count(this_00);
  if (capacity == iVar1) {
    t = ::ON_SimpleArray::operator_cast_to_double_((ON_SimpleArray *)&this->m_t);
    SetParameterization(this_00,t);
  }
  return &this_00->super_ON_Curve;
}

Assistant:

ON_Curve* ON_PolyCurve::DuplicateCurve() const
{
	// Call DuplicateCurve on each segment to construct duplicate curve.
	int cnt = Count();
	ON_PolyCurve* dup_crv = new ON_PolyCurve( cnt );
  dup_crv->CopyUserData(*this);
	for( int i=0; i<cnt; i++){
		const ON_Curve* seg = SegmentCurve(i);
		if(seg)
			dup_crv->Append( seg->DuplicateCurve() );
	}	
	if( cnt == dup_crv->Count() )
		dup_crv->SetParameterization( m_t);
	return dup_crv;
}